

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  size_t sVar1;
  pointer ppVar2;
  long lVar3;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  char *message;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar4;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> gen;
  AssertionResult gtest_ar;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> local_9b1;
  key_equal local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a8;
  vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_9a0;
  int local_988;
  slot_type *local_980;
  size_t sStack_978;
  size_t local_970;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> local_968;
  EnumClass local_958;
  int local_950;
  EnumClass local_948;
  int local_940;
  EnumClass local_938;
  int local_930;
  EnumClass local_928;
  int local_920;
  undefined1 local_918 [8];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_910;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_490;
  
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_9b1);
  local_968.first = pVar4.first;
  local_968.second = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_9b1);
  local_958 = pVar4.first;
  local_950 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_9b1);
  local_948 = pVar4.first;
  local_940 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_9b1);
  local_938 = pVar4.first;
  local_930 = pVar4.second;
  pVar4 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_9b1);
  local_928 = pVar4.first;
  local_920 = pVar4.second;
  lVar3 = 0x40;
  do {
    ppVar2 = hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
             next_id<phmap::priv::StatefulTestingHash>()::gId;
    sVar1 = hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
            next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x30) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x28) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x40) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x38) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x18) = 0;
    *(size_t *)((long)local_490.sets_._M_elems + lVar3 + -0x10) = sVar1;
    local_9b0.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
         (WithId<phmap::priv::StatefulTestingEqual>)(sVar1 + 1);
    *(pointer *)((long)local_490.sets_._M_elems + lVar3 + -8) = ppVar2;
    local_9a0.
    super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&ppVar2->first + 1);
    *(undefined8 *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
         (size_t)local_9b0.super_WithId<phmap::priv::StatefulTestingEqual>.id_;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         local_9a0.
         super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar3 != 0x4c0);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId = (pointer)((long)&ppVar2->first + 2);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ = sVar1 + 2;
  local_918 = (undefined1  [8])0x0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_910,&local_968,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_918,0,
             (hasher *)&local_9a0,&local_9b0,(allocator_type *)local_918);
  lVar3 = 0;
  do {
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::move_assign((raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                   *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar3),
                  (long)&local_910.sets_._M_elems[0].set_.ctrl_ + lVar3);
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x480);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_910);
  local_988 = 3;
  std::
  vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const*,void>
            ((vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_980,&local_968,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_918,
             (allocator_type *)&local_9a0);
  local_910.sets_._M_elems[0].set_.capacity_ = local_970;
  local_910.sets_._M_elems[0].set_.size_ = sStack_978;
  local_910.sets_._M_elems[0].set_.slots_ = local_980;
  local_980 = (slot_type *)0x0;
  sStack_978 = 0;
  local_970 = 0;
  local_910.sets_._M_elems[0].set_.ctrl_._0_4_ = local_988;
  items<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>>
            (&local_9a0,(priv *)&local_490,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::operator()(&local_9b0,(char *)&local_910,
               (vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                *)"items(m)");
  if (local_9a0.
      super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_9a0.
                    super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_9a0.
                          super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_9a0.
                          super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_910.sets_._M_elems[0].set_.slots_ != (slot_type *)0x0) {
    operator_delete(local_910.sets_._M_elems[0].set_.slots_,
                    local_910.sets_._M_elems[0].set_.capacity_ -
                    (long)local_910.sets_._M_elems[0].set_.slots_);
  }
  if (local_980 != (slot_type *)0x0) {
    operator_delete(local_980,local_970 - (long)local_980);
  }
  if ((char)local_9b0.super_WithId<phmap::priv::StatefulTestingEqual>.id_ == '\0') {
    testing::Message::Message((Message *)&local_910);
    if (local_9a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_9a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1b6,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_9a0,(Message *)&local_910);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9a0);
    if ((long *)CONCAT44(local_910.sets_._M_elems[0].set_.ctrl_._4_4_,
                         (int)local_910.sets_._M_elems[0].set_.ctrl_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_910.sets_._M_elems[0].set_.ctrl_._4_4_,
                                     (int)local_910.sets_._M_elems[0].set_.ctrl_) + 8))();
    }
  }
  if (local_9a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_9a8,local_9a8);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}